

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O1

void __thiscall pbrt::ThreadPool::RemoveFromJobList(ThreadPool *this,ParallelJob *job)

{
  ParallelJob *pPVar1;
  ParallelJob **ppPVar2;
  
  pPVar1 = job->prev;
  ppPVar2 = &pPVar1->next;
  if (pPVar1 == (ParallelJob *)0x0) {
    ppPVar2 = &this->jobList;
  }
  *ppPVar2 = job->next;
  if (job->next != (ParallelJob *)0x0) {
    job->next->prev = pPVar1;
  }
  job->removed = true;
  return;
}

Assistant:

void ThreadPool::RemoveFromJobList(ParallelJob *job) {
    DCHECK(!job->removed);

    if (job->prev != nullptr)
        job->prev->next = job->next;
    else {
        DCHECK(jobList == job);
        jobList = job->next;
    }
    if (job->next != nullptr)
        job->next->prev = job->prev;

    job->removed = true;
}